

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

int __thiscall PP_Expression::unary_expression(PP_Expression *this)

{
  Token TVar1;
  Symbol *pSVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  Token *pTVar8;
  
  pSVar2 = (this->super_Parser).symbols.d.ptr;
  lVar3 = (this->super_Parser).symbols.d.size;
  lVar6 = (this->super_Parser).index;
  uVar7 = 0;
  while( true ) {
    pTVar8 = &pSVar2[lVar6].token;
    do {
      if (lVar3 <= lVar6) goto LAB_0013e9de;
      lVar6 = lVar6 + 1;
      (this->super_Parser).index = lVar6;
      TVar1 = *pTVar8;
      pTVar8 = pTVar8 + 0xc;
    } while (TVar1 == PLUS);
    if (0x45 < (int)TVar1) break;
    if (TVar1 == MINUS) {
      iVar5 = unary_expression(this);
      uVar4 = -iVar5;
      goto LAB_0013ea10;
    }
    if (TVar1 != PP_TILDE) goto LAB_0013e9de;
    uVar7 = ~uVar7;
  }
  if (TVar1 == NOT) {
    iVar5 = unary_expression(this);
    uVar4 = (uint)(iVar5 == 0);
    goto LAB_0013ea10;
  }
  if (TVar1 == PP_MOC_TRUE) {
    uVar4 = 1;
    goto LAB_0013ea10;
  }
  if (TVar1 == PP_MOC_FALSE) {
    uVar4 = 0;
    goto LAB_0013ea10;
  }
LAB_0013e9de:
  (this->super_Parser).index = lVar6 + -1;
  uVar4 = primary_expression(this);
LAB_0013ea10:
  return uVar4 ^ uVar7;
}

Assistant:

int PP_Expression::unary_expression()
{
    switch (next()) {
    case PP_PLUS:
        return unary_expression();
    case PP_MINUS:
        return -unary_expression();
    case PP_NOT:
        return !unary_expression();
    case PP_TILDE:
        return ~unary_expression();
    case PP_MOC_TRUE:
        return 1;
    case PP_MOC_FALSE:
        return 0;
    default:
        prev();
        return primary_expression();
    }
}